

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O1

void __thiscall rlottie::internal::model::Repeater::Transform::~Transform(Transform *this)

{
  Property<float,_void> *pPVar1;
  Property<VPointF,_void> *pPVar2;
  details __ptr_00;
  pointer *__ptr_5;
  pointer *__ptr;
  
  if ((this->mEndOpacity).isValue_ == false) {
    pPVar1 = &this->mEndOpacity;
    if (pPVar1->impl_ != (details)0x0) {
      std::default_delete<rlottie::internal::model::KeyFrames<float,_void>_>::operator()
                ((default_delete<rlottie::internal::model::KeyFrames<float,_void>_> *)pPVar1,
                 (KeyFrames<float,_void> *)pPVar1->impl_);
    }
    pPVar1->impl_ = (details)0x0;
  }
  if ((this->mStartOpacity).isValue_ == false) {
    pPVar1 = &this->mStartOpacity;
    if (pPVar1->impl_ != (details)0x0) {
      std::default_delete<rlottie::internal::model::KeyFrames<float,_void>_>::operator()
                ((default_delete<rlottie::internal::model::KeyFrames<float,_void>_> *)pPVar1,
                 (KeyFrames<float,_void> *)pPVar1->impl_);
    }
    pPVar1->impl_ = (details)0x0;
  }
  if ((this->mAnchor).isValue_ == false) {
    pPVar2 = &this->mAnchor;
    if (pPVar2->impl_ != (details)0x0) {
      std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>::operator()
                ((default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_> *)pPVar2,
                 (KeyFrames<VPointF,_void> *)pPVar2->impl_);
    }
    pPVar2->impl_ = (details)0x0;
  }
  if ((this->mPosition).isValue_ == false) {
    pPVar2 = &this->mPosition;
    if (pPVar2->impl_ != (details)0x0) {
      std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>::operator()
                ((default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_> *)pPVar2,
                 (KeyFrames<VPointF,_void> *)pPVar2->impl_);
    }
    pPVar2->impl_ = (details)0x0;
  }
  if ((this->mScale).isValue_ == false) {
    pPVar2 = &this->mScale;
    if (pPVar2->impl_ != (details)0x0) {
      std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>::operator()
                ((default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_> *)pPVar2,
                 (KeyFrames<VPointF,_void> *)pPVar2->impl_);
    }
    pPVar2->impl_ = (details)0x0;
  }
  if ((this->mRotation).isValue_ == false) {
    __ptr_00 = (this->mRotation).impl_;
    if (__ptr_00 != (details)0x0) {
      std::default_delete<rlottie::internal::model::KeyFrames<float,_void>_>::operator()
                ((default_delete<rlottie::internal::model::KeyFrames<float,_void>_> *)this,
                 (KeyFrames<float,_void> *)__ptr_00);
    }
    (this->mRotation).impl_ = (details)0x0;
  }
  return;
}

Assistant:

float   startOpacity(int frameNo) const
        {
            return mStartOpacity.value(frameNo) / 100;
        }